

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_dwp.c
# Opt level: O0

void beltDWPStepI(void *buf,size_t count,void *state)

{
  void *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *unaff_retaddr;
  belt_dwp_st *st;
  void *in_stack_ffffffffffffffd8;
  void *stack;
  
  stack = in_RDX;
  beltHalfBlockAddBitSizeW((word *)((long)in_RDX + 0x78),(size_t)in_RSI);
  if (*(long *)((long)in_RDX + 0x98) != 0) {
    if (in_RSI < (word *)(0x10U - *(long *)((long)in_RDX + 0x98))) {
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x172b15);
      *(long *)((long)in_RDX + 0x98) = (long)in_RSI + *(long *)((long)in_RDX + 0x98);
      return;
    }
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x172b65);
    in_RSI = (word *)((long)in_RSI - (0x10 - *(long *)((long)in_RDX + 0x98)));
    in_RDI = (word *)((long)in_RDI + (0x10 - *(long *)((long)in_RDX + 0x98)));
    *(ulong *)((long)in_RDX + 0x58) =
         *(ulong *)((long)in_RDX + 0x88) ^ *(ulong *)((long)in_RDX + 0x58);
    *(ulong *)((long)in_RDX + 0x60) =
         *(ulong *)((long)in_RDX + 0x90) ^ *(ulong *)((long)in_RDX + 0x60);
    beltPolyMul(unaff_retaddr,in_RDI,in_RSI,stack);
    *(undefined8 *)((long)in_RDX + 0x98) = 0;
  }
  for (; (word *)0xf < in_RSI; in_RSI = in_RSI + -2) {
    *(word *)((long)in_RDX + 0x88) = *in_RDI;
    *(word *)((long)in_RDX + 0x90) = in_RDI[1];
    *(ulong *)((long)in_RDX + 0x58) =
         *(ulong *)((long)in_RDX + 0x88) ^ *(ulong *)((long)in_RDX + 0x58);
    *(ulong *)((long)in_RDX + 0x60) =
         *(ulong *)((long)in_RDX + 0x90) ^ *(ulong *)((long)in_RDX + 0x60);
    beltPolyMul(unaff_retaddr,in_RDI,in_RSI,stack);
    in_RDI = in_RDI + 2;
  }
  if (in_RSI != (word *)0x0) {
    *(word **)((long)in_RDX + 0x98) = in_RSI;
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x172cf5);
  }
  return;
}

Assistant:

void beltDWPStepI(const void* buf, size_t count, void* state)
{
	belt_dwp_st* st = (belt_dwp_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltDWP_keep()));
	// критические данные не обрабатывались?
	ASSERT(count == 0 || beltHalfBlockIsZero(st->len + W_OF_B(64)));
	// обновить длину
	beltHalfBlockAddBitSizeW(st->len, count);
	// есть накопленные данные?
	if (st->filled)
	{
		if (count < 16 - st->filled)
		{
			memCopy(st->block + st->filled, buf, count);
			st->filled += count;
			return;
		}
		memCopy(st->block + st->filled, buf, 16 - st->filled);
		count -= 16 - st->filled;
		buf = (const octet*)buf + 16 - st->filled;
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		st->filled = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockCopy(st->block, buf);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		buf = (const octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
		memCopy(st->block, buf, st->filled = count);
}